

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unixFullPathname(unqlite_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  
  if (*zPath == '/') {
    iVar4 = 0;
    Systrcpy(zOut,nOut,zPath,0);
  }
  else {
    zOut[(long)nOut + -1] = '\0';
    pcVar3 = getcwd(zOut,(long)nOut - 1);
    if (pcVar3 == (char *)0x0) {
      iVar4 = -2;
    }
    else {
      pcVar3 = zOut;
      if (*zOut != '\0') {
        pcVar1 = zOut + 2;
        do {
          pcVar3 = pcVar1;
          if (pcVar3[-1] == '\0') {
            pcVar3 = pcVar3 + -1;
            goto LAB_0010f622;
          }
          if (*pcVar3 == '\0') goto LAB_0010f622;
          if (pcVar3[1] == '\0') {
            pcVar3 = pcVar3 + 1;
            goto LAB_0010f622;
          }
          pcVar1 = pcVar3 + 4;
        } while (pcVar3[2] != '\0');
        pcVar3 = pcVar3 + 2;
      }
LAB_0010f622:
      uVar2 = (int)pcVar3 - (int)zOut;
      iVar4 = 0;
      SyBufferFormat(zOut + uVar2,nOut - uVar2,"/%s",zPath);
    }
  }
  return iVar4;
}

Assistant:

static int unixFullPathname(
  unqlite_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
  if( zPath[0]=='/' ){
	  Systrcpy(zOut,(sxu32)nOut,zPath,0);
	  SXUNUSED(pVfs);
  }else{
    sxu32 nCwd;
	zOut[nOut-1] = '\0';
    if( getcwd(zOut, nOut-1)==0 ){
		return UNQLITE_IOERR;
    }
    nCwd = SyStrlen(zOut);
    SyBufferFormat(&zOut[nCwd],(sxu32)nOut-nCwd,"/%s",zPath);
  }
  return UNQLITE_OK;
}